

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O0

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  undefined1 uVar1;
  char *pcVar2;
  bool bVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  FT_Pointer pvVar8;
  char *pcVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  FT_Byte *p;
  FT_ULong len;
  int i;
  FT_Long tmp;
  FT_ULong size;
  T42_Load_Status status;
  FT_Bool allocated;
  FT_Byte *string_buf;
  FT_ULong real_size;
  FT_ULong old_string_size;
  FT_ULong string_size;
  FT_ULong n;
  FT_Long count;
  FT_Int num_tables;
  FT_Error error;
  FT_Byte *limit;
  FT_Byte *cur;
  FT_Memory memory;
  T42_Parser parser;
  T42_Loader loader_local;
  T42_Face face_local;
  
  cur = (FT_Byte *)(loader->parser).root.memory;
  _num_tables = (loader->parser).root.limit;
  count._0_4_ = 0;
  _status = (T42_Loader)0x0;
  bVar3 = false;
  memory = (FT_Memory)loader;
  parser = &loader->parser;
  loader_local = (T42_Loader)face;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  if (memory->user < _num_tables) {
    pcVar2 = (char *)memory->user;
    pcVar9 = pcVar2 + 1;
    memory->user = pcVar9;
    if (*pcVar2 == '[') {
      (*memory[1].realloc)(memory,(long)loader,(long)pcVar9,memory);
      size._0_4_ = 0;
      old_string_size = 0;
      real_size = 0;
      n = 0;
      lVar6 = extraout_RDX;
      while (memory->user < _num_tables) {
        limit = (FT_Byte *)memory->user;
        if (*limit == 0x5d) {
          memory->user = (void *)((long)memory->user + 1);
          goto LAB_0035475b;
        }
        if (*limit == 0x3c) {
          (*(code *)memory[2].user)(memory);
          if (*(int *)&memory->realloc != 0) goto LAB_0035475b;
          old_string_size = ((long)memory->user + (-1 - (long)limit)) / 2;
          if (old_string_size == 0) {
            count._4_4_ = 3;
            goto LAB_00354751;
          }
          _status = (T42_Loader)
                    ft_mem_realloc((FT_Memory)cur,1,real_size,old_string_size,_status,
                                   (FT_Error *)((long)&count + 4));
          if (count._4_4_ != 0) goto LAB_00354751;
          bVar3 = true;
          memory->user = limit;
          loader = _status;
          (*memory[2].realloc)(memory,(long)_status,old_string_size,&string_buf);
          real_size = old_string_size;
          old_string_size = (FT_ULong)string_buf;
          lVar6 = extraout_RDX_00;
        }
        else if (*limit - 0x30 < 10) {
          if (bVar3) {
            count._4_4_ = 3;
            goto LAB_00354751;
          }
          pvVar4 = (*memory[2].alloc)(memory,(long)loader);
          if ((long)pvVar4 < 0) {
            count._4_4_ = 3;
            goto LAB_00354751;
          }
          old_string_size = (FT_ULong)pvVar4;
          (*(code *)memory[2].user)(memory);
          if (*(int *)&memory->realloc != 0) {
            return;
          }
          _status = (T42_Loader)((long)memory->user + 1);
          if ((ulong)((long)_num_tables - (long)memory->user) <= old_string_size) {
            count._4_4_ = 3;
            goto LAB_00354751;
          }
          memory->user = (void *)(old_string_size + 1 + (long)memory->user);
          lVar6 = extraout_RDX_01;
        }
        if (_status == (T42_Loader)0x0) {
          count._4_4_ = 3;
          goto LAB_00354751;
        }
        if (((old_string_size & 1) != 0) &&
           (*(char *)((long)_status + (old_string_size - 1)) == '\0')) {
          old_string_size = old_string_size - 1;
        }
        if (old_string_size == 0) {
          count._4_4_ = 3;
          goto LAB_00354751;
        }
        pvVar4 = memory->user;
        uVar5 = (long)_num_tables - (long)pvVar4;
        for (string_size = 0; string_size < old_string_size; string_size = string_size + 1) {
          if ((int)size == 0) {
            if (0xb < (long)n) {
              count._0_4_ = (uint)*(byte *)(*(long *)&loader_local[1].encoding_table.max_elems + 4)
                            * 0x10 + (uint)*(byte *)(*(long *)&loader_local[1].encoding_table.
                                                               max_elems + 5);
              size._0_4_ = 1;
              loader_local[1].encoding_table.elements = (FT_Byte **)(long)((int)count * 0x10 + 0xc);
              if ((long)uVar5 < (long)loader_local[1].encoding_table.elements) {
                count._4_4_ = 3;
              }
              else {
                pvVar8 = ft_mem_realloc((FT_Memory)cur,1,0xc,
                                        (FT_Long)loader_local[1].encoding_table.elements,
                                        *(void **)&loader_local[1].encoding_table.max_elems,
                                        (FT_Error *)((long)&count + 4));
                *(FT_Pointer *)&loader_local[1].encoding_table.max_elems = pvVar8;
                lVar6 = extraout_RDX_02;
                if (count._4_4_ == 0) goto LAB_00354549;
              }
              goto LAB_00354751;
            }
            uVar1 = *(undefined1 *)((long)&(_status->parser).root.cursor + string_size);
            lVar6 = CONCAT71((int7)((ulong)lVar6 >> 8),uVar1);
            loader = (T42_Loader)(n + 1);
            *(undefined1 *)(*(long *)&loader_local[1].encoding_table.max_elems + n) = uVar1;
            pvVar4 = (void *)n;
            n = (FT_ULong)loader;
          }
          else {
            if ((int)size == 1) {
LAB_00354549:
              if ((long)n < (long)loader_local[1].encoding_table.elements) {
                uVar1 = *(undefined1 *)((long)&(_status->parser).root.cursor + string_size);
                lVar6 = CONCAT71((int7)((ulong)lVar6 >> 8),uVar1);
                loader = (T42_Loader)(n + 1);
                *(undefined1 *)(*(long *)&loader_local[1].encoding_table.max_elems + n) = uVar1;
                pvVar4 = (void *)n;
                n = (FT_ULong)loader;
                goto LAB_00354726;
              }
              for (len._4_4_ = 0; len._4_4_ < (int)count; len._4_4_ = len._4_4_ + 1) {
                lVar6 = *(long *)&loader_local[1].encoding_table.max_elems + (long)(len._4_4_ << 4);
                uVar7 = (ulong)((uint)*(byte *)(lVar6 + 0x18) << 0x18 |
                                (uint)*(byte *)(lVar6 + 0x19) << 0x10 |
                                (uint)*(byte *)(lVar6 + 0x1a) << 8 | (uint)*(byte *)(lVar6 + 0x1b));
                if ((uVar5 < uVar7) ||
                   ((long)(uVar5 - uVar7) < (long)loader_local[1].encoding_table.elements)) {
                  count._4_4_ = 3;
                  goto LAB_00354751;
                }
                loader_local[1].encoding_table.elements =
                     (FT_Byte **)
                     ((uVar7 + 3 & 0xfffffffc) + (long)loader_local[1].encoding_table.elements);
              }
              size._0_4_ = 2;
              pvVar8 = ft_mem_realloc((FT_Memory)cur,1,(long)((int)count * 0x10 + 0xc),
                                      (long)loader_local[1].encoding_table.elements + 1,
                                      *(void **)&loader_local[1].encoding_table.max_elems,
                                      (FT_Error *)((long)&count + 4));
              *(FT_Pointer *)&loader_local[1].encoding_table.max_elems = pvVar8;
              lVar6 = extraout_RDX_03;
              if (count._4_4_ != 0) goto LAB_00354751;
            }
            else if ((int)size != 2) goto LAB_00354726;
            if ((long)loader_local[1].encoding_table.elements <= (long)n) {
              count._4_4_ = 3;
              goto LAB_00354751;
            }
            uVar1 = *(undefined1 *)((long)&(_status->parser).root.cursor + string_size);
            lVar6 = CONCAT71((int7)((ulong)lVar6 >> 8),uVar1);
            loader = (T42_Loader)(n + 1);
            *(undefined1 *)(*(long *)&loader_local[1].encoding_table.max_elems + n) = uVar1;
            pvVar4 = (void *)n;
            n = (FT_ULong)loader;
          }
LAB_00354726:
        }
        (*memory[1].realloc)(memory,(long)loader,lVar6,pvVar4);
        lVar6 = extraout_RDX_04;
      }
      count._4_4_ = 3;
      goto LAB_00354751;
    }
  }
  count._4_4_ = 3;
LAB_00354751:
  *(int *)&memory->realloc = count._4_4_;
LAB_0035475b:
  if (bVar3) {
    ft_mem_free((FT_Memory)cur,_status);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     count;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;


    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    count           = 0;

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_REALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( count < 12 )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            num_tables     = 16 * face->ttf_data[4] + face->ttf_data[5];
            status         = BEFORE_TABLE_DIR;
            face->ttf_size = 12 + 16 * num_tables;

            if ( (FT_Long)size < face->ttf_size )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_REALLOC( face->ttf_data, 12, face->ttf_size ) )
              goto Fail;
          }
          /* fall through */

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( count < face->ttf_size )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;


            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              if ( len > size                               ||
                   face->ttf_size > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              face->ttf_size += (FT_Long)( ( len + 3 ) & ~3U );
            }

            status = OTHER_TABLES;

            if ( FT_REALLOC( face->ttf_data, 12 + 16 * num_tables,
                             face->ttf_size + 1 ) )
              goto Fail;
          }
          /* fall through */

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( count >= face->ttf_size )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( allocated )
      FT_FREE( string_buf );
  }